

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (Set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                *col1,Set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                      *col2)

{
  Index IVar1;
  Dimension DVar2;
  ID_index IVar3;
  Index IVar4;
  Row_container *pRVar5;
  Field_operators *pFVar6;
  Entry_constructor *pEVar7;
  
  pRVar5 = (col1->super_Row_access_option).rows_;
  (col1->super_Row_access_option).rows_ = (col2->super_Row_access_option).rows_;
  (col2->super_Row_access_option).rows_ = pRVar5;
  IVar1 = (col1->super_Row_access_option).columnIndex_;
  (col1->super_Row_access_option).columnIndex_ = (col2->super_Row_access_option).columnIndex_;
  (col2->super_Row_access_option).columnIndex_ = IVar1;
  DVar2 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar2;
  IVar3 = (col1->super_Chain_column_option).pivot_;
  (col1->super_Chain_column_option).pivot_ = (col2->super_Chain_column_option).pivot_;
  (col2->super_Chain_column_option).pivot_ = IVar3;
  IVar4 = (col1->super_Chain_column_option).pairedColumn_;
  (col1->super_Chain_column_option).pairedColumn_ = (col2->super_Chain_column_option).pairedColumn_;
  (col2->super_Chain_column_option).pairedColumn_ = IVar4;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_*>_>
  ::swap(&(col1->column_)._M_t,&(col2->column_)._M_t);
  pFVar6 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar6;
  pEVar7 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar7;
  return;
}

Assistant:

void swap(Set_column& col1, Set_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }